

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O2

vector<int,_std::allocator<int>_> * muduo::ProcessInfo::threads(void)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  long in_FS_OFFSET;
  
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(vector<int,_std::allocator<int>_> **)(in_FS_OFFSET + -8) = in_RDI;
  detail::scanDir("/proc/self/task",detail::taskDirFilter);
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start,
             (in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish);
  return in_RDI;
}

Assistant:

std::vector<pid_t> ProcessInfo::threads()
{
  std::vector<pid_t> result;
  t_pids = &result;
  scanDir("/proc/self/task", taskDirFilter);
  t_pids = NULL;
  std::sort(result.begin(), result.end());
  return result;
}